

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3813_9.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementHexaANCF_3813_9::LoadableGetStateBlock_w
          (ChElementHexaANCF_3813_9 *this,int block_offset,ChStateDelta *mD)

{
  double *pdVar1;
  pointer psVar2;
  element_type *peVar3;
  element_type *peVar4;
  Index index_3;
  long lVar5;
  Index index;
  ulong uVar6;
  Index index_1;
  double *pdVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  
  pdVar1 = (mD->super_ChVectorDynamic<double>).
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  psVar2 = (this->m_nodes).
           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar9 = 0;
  pdVar7 = pdVar1 + block_offset;
  lVar5 = (mD->super_ChVectorDynamic<double>).
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows + -3;
  do {
    if ((block_offset < 0) || (lVar11 = lVar9 * 3 + (long)block_offset, lVar5 < lVar11))
    goto LAB_006dd618;
    uVar6 = 3;
    peVar3 = psVar2[lVar9].super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    if (((ulong)pdVar1 & 7) == 0) {
      uVar10 = -((uint)((ulong)(pdVar1 + lVar11) >> 3) & 0x1fffffff) & 7;
      if ((ulong)uVar10 < 3) {
        uVar6 = (ulong)uVar10;
      }
      if (uVar10 != 0) goto LAB_006dd477;
    }
    else {
LAB_006dd477:
      uVar12 = 0;
      do {
        pdVar7[uVar12] = *(double *)((long)&peVar3->X0 + uVar12 * 8 + 0xffffffffffffff80);
        uVar12 = uVar12 + 1;
      } while (uVar6 != uVar12);
    }
    if (uVar6 < 3) {
      do {
        pdVar7[uVar6] = *(double *)((long)&peVar3->X0 + uVar6 * 8 + 0xffffffffffffff80);
        uVar6 = uVar6 + 1;
      } while (uVar6 != 3);
    }
    lVar9 = lVar9 + 1;
    pdVar7 = pdVar7 + 3;
  } while (lVar9 != 8);
  uVar6 = (ulong)(uint)block_offset;
  if (lVar5 < (long)(uVar6 + 0x18)) goto LAB_006dd618;
  peVar4 = (this->m_central_node).
           super___shared_ptr<chrono::fea::ChNodeFEAcurv,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pdVar7 = pdVar1 + uVar6 + 0x18;
  uVar12 = 3;
  if (((ulong)pdVar7 & 7) == 0) {
    uVar10 = -((uint)((ulong)pdVar7 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar10 < 3) {
      uVar12 = (ulong)uVar10;
    }
    if (uVar10 != 0) goto LAB_006dd501;
  }
  else {
LAB_006dd501:
    uVar8 = 0;
    do {
      pdVar7[uVar8] = (peVar4->m_rxx_dt).m_data[uVar8];
      uVar8 = uVar8 + 1;
    } while (uVar12 != uVar8);
  }
  if (uVar12 < 3) {
    do {
      pdVar7[uVar12] = (peVar4->m_rxx_dt).m_data[uVar12];
      uVar12 = uVar12 + 1;
    } while (uVar12 != 3);
  }
  if (lVar5 < (long)(uVar6 + 0x1b)) goto LAB_006dd618;
  pdVar7 = pdVar1 + uVar6 + 0x1b;
  uVar12 = 3;
  if (((ulong)pdVar7 & 7) == 0) {
    uVar10 = -((uint)((ulong)pdVar7 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar10 < 3) {
      uVar12 = (ulong)uVar10;
    }
    if (uVar10 != 0) goto LAB_006dd571;
  }
  else {
LAB_006dd571:
    uVar8 = 0;
    do {
      pdVar7[uVar8] = (peVar4->m_ryy_dt).m_data[uVar8];
      uVar8 = uVar8 + 1;
    } while (uVar12 != uVar8);
  }
  if (uVar12 < 3) {
    do {
      pdVar7[uVar12] = (peVar4->m_ryy_dt).m_data[uVar12];
      uVar12 = uVar12 + 1;
    } while (uVar12 != 3);
  }
  if (lVar5 < (long)(uVar6 + 0x1e)) {
LAB_006dd618:
    __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                  ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                  "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                 );
  }
  pdVar1 = pdVar1 + uVar6 + 0x1e;
  uVar6 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar10 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar10 < 3) {
      uVar6 = (ulong)uVar10;
    }
    if (uVar10 == 0) goto LAB_006dd5f3;
  }
  uVar12 = 0;
  do {
    pdVar1[uVar12] = (peVar4->m_rzz_dt).m_data[uVar12];
    uVar12 = uVar12 + 1;
  } while (uVar6 != uVar12);
LAB_006dd5f3:
  if (uVar6 < 3) {
    do {
      pdVar1[uVar6] = (peVar4->m_rzz_dt).m_data[uVar6];
      uVar6 = uVar6 + 1;
    } while (uVar6 != 3);
  }
  return;
}

Assistant:

void ChElementHexaANCF_3813_9::LoadableGetStateBlock_w(int block_offset, ChStateDelta& mD) {
    for (int i = 0; i < 8; i++) {
        mD.segment(block_offset + 3 * i, 3) = m_nodes[i]->GetPos_dt().eigen();
    }
    mD.segment(block_offset + 24, 3) = m_central_node->GetCurvatureXX_dt().eigen();
    mD.segment(block_offset + 27, 3) = m_central_node->GetCurvatureYY_dt().eigen();
    mD.segment(block_offset + 30, 3) = m_central_node->GetCurvatureZZ_dt().eigen();
}